

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O1

_Bool trans_ORN_pppp(DisasContext_conflict1 *s,arg_rprr_s *a)

{
  _Bool _Var1;
  
  if (a->s != 0) {
    _Var1 = do_pppp_flags(s,a,&trans_ORN_pppp::op);
    return _Var1;
  }
  _Var1 = do_vecop4_p(s,&trans_ORN_pppp::op,a->rd,a->rn,a->rm,a->pg);
  return _Var1;
}

Assistant:

static bool trans_ORN_pppp(DisasContext *s, arg_rprr_s *a)
{
    static const GVecGen4 op = {
        .fni8 = gen_orn_pg_i64,
        .fniv = gen_orn_pg_vec,
        .fno = gen_helper_sve_orn_pppp,
        .prefer_i64 = TCG_TARGET_REG_BITS == 64,
    };
    if (a->s) {
        return do_pppp_flags(s, a, &op);
    } else {
        return do_vecop4_p(s, &op, a->rd, a->rn, a->rm, a->pg);
    }
}